

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SAX2.c
# Opt level: O0

void xmlSAX2Text(xmlParserCtxtPtr ctxt,xmlChar *ch,int len,xmlElementType type)

{
  xmlNodePtr node;
  int iVar1;
  xmlChar *pxVar2;
  bool bVar3;
  int local_48;
  int local_44;
  int size;
  xmlChar *newbuf;
  xmlNodePtr pxStack_28;
  int coalesceText;
  xmlNodePtr lastChild;
  xmlElementType type_local;
  int len_local;
  xmlChar *ch_local;
  xmlParserCtxtPtr ctxt_local;
  
  if ((ctxt != (xmlParserCtxtPtr)0x0) && (ctxt->node != (xmlNodePtr)0x0)) {
    node = ctxt->node->last;
    if (node == (xmlNodePtr)0x0) {
      if (type == XML_TEXT_NODE) {
        pxStack_28 = xmlSAX2TextNode(ctxt,ch,len);
      }
      else {
        pxStack_28 = xmlNewCDataBlock(ctxt->myDoc,ch,len);
      }
      if (pxStack_28 == (xmlNodePtr)0x0) {
        xmlSAX2ErrMemory(ctxt,"xmlSAX2Characters");
      }
      else {
        ctxt->node->children = pxStack_28;
        ctxt->node->last = pxStack_28;
        pxStack_28->parent = ctxt->node;
        pxStack_28->doc = ctxt->node->doc;
        ctxt->nodelen = len;
        ctxt->nodemem = len + 1;
      }
    }
    else {
      bVar3 = false;
      if (((node != (xmlNodePtr)0x0) && (bVar3 = false, node->type == type)) &&
         (bVar3 = true, type == XML_TEXT_NODE)) {
        bVar3 = node->name == "text";
      }
      if ((bVar3) && (ctxt->nodemem != 0)) {
        if ((_xmlAttr **)node->content == &node->properties) {
          pxVar2 = xmlStrdup(node->content);
          node->content = pxVar2;
          node->properties = (_xmlAttr *)0x0;
        }
        else if ((ctxt->nodemem == ctxt->nodelen + 1) &&
                (iVar1 = xmlDictOwns(ctxt->dict,node->content), iVar1 != 0)) {
          pxVar2 = xmlStrdup(node->content);
          node->content = pxVar2;
        }
        if (node->content == (xmlChar *)0x0) {
          xmlSAX2ErrMemory(ctxt,"xmlSAX2Characters: xmlStrdup returned NULL");
        }
        else if (0x7fffffff - len < ctxt->nodelen) {
          xmlSAX2ErrMemory(ctxt,"xmlSAX2Characters overflow prevented");
        }
        else if ((ctxt->nodelen + len < 0x989681) || ((ctxt->options & 0x80000U) != 0)) {
          if (ctxt->nodemem <= ctxt->nodelen + len) {
            if (0x7fffffff - len < ctxt->nodemem) {
              local_44 = 0x7fffffff;
            }
            else {
              local_44 = ctxt->nodemem + len;
            }
            if (local_44 < 0x40000000) {
              local_48 = local_44 << 1;
            }
            else {
              local_48 = 0x7fffffff;
            }
            pxVar2 = (xmlChar *)(*xmlRealloc)(node->content,(long)local_48);
            if (pxVar2 == (xmlChar *)0x0) {
              xmlSAX2ErrMemory(ctxt,"xmlSAX2Characters");
              return;
            }
            ctxt->nodemem = local_48;
            node->content = pxVar2;
          }
          memcpy(node->content + ctxt->nodelen,ch,(long)len);
          ctxt->nodelen = len + ctxt->nodelen;
          node->content[ctxt->nodelen] = '\0';
        }
        else {
          xmlSAX2ErrMemory(ctxt,"xmlSAX2Characters: huge text node");
        }
      }
      else if (bVar3) {
        iVar1 = xmlTextConcat(node,ch,len);
        if (iVar1 != 0) {
          xmlSAX2ErrMemory(ctxt,"xmlSAX2Characters");
        }
        if (ctxt->node->children != (_xmlNode *)0x0) {
          iVar1 = xmlStrlen(node->content);
          ctxt->nodelen = iVar1;
          ctxt->nodemem = ctxt->nodelen + 1;
        }
      }
      else {
        if (type == XML_TEXT_NODE) {
          pxStack_28 = xmlSAX2TextNode(ctxt,ch,len);
          pxStack_28->doc = ctxt->myDoc;
        }
        else {
          pxStack_28 = xmlNewCDataBlock(ctxt->myDoc,ch,len);
        }
        if ((pxStack_28 != (xmlNodePtr)0x0) &&
           (xmlAddChild(ctxt->node,pxStack_28), ctxt->node->children != (_xmlNode *)0x0)) {
          ctxt->nodelen = len;
          ctxt->nodemem = len + 1;
        }
      }
    }
  }
  return;
}

Assistant:

static void
xmlSAX2Text(xmlParserCtxtPtr ctxt, const xmlChar *ch, int len,
            xmlElementType type)
{
    xmlNodePtr lastChild;

    if (ctxt == NULL) return;
#ifdef DEBUG_SAX
    xmlGenericError(xmlGenericErrorContext,
	    "SAX.xmlSAX2Characters(%.30s, %d)\n", ch, len);
#endif
    /*
     * Handle the data if any. If there is no child
     * add it as content, otherwise if the last child is text,
     * concatenate it, else create a new node of type text.
     */

    if (ctxt->node == NULL) {
#ifdef DEBUG_SAX_TREE
	xmlGenericError(xmlGenericErrorContext,
		"add chars: ctxt->node == NULL !\n");
#endif
        return;
    }
    lastChild = ctxt->node->last;
#ifdef DEBUG_SAX_TREE
    xmlGenericError(xmlGenericErrorContext,
	    "add chars to %s \n", ctxt->node->name);
#endif

    /*
     * Here we needed an accelerator mechanism in case of very large
     * elements. Use an attribute in the structure !!!
     */
    if (lastChild == NULL) {
        if (type == XML_TEXT_NODE)
            lastChild = xmlSAX2TextNode(ctxt, ch, len);
        else
            lastChild = xmlNewCDataBlock(ctxt->myDoc, ch, len);
	if (lastChild != NULL) {
	    ctxt->node->children = lastChild;
	    ctxt->node->last = lastChild;
	    lastChild->parent = ctxt->node;
	    lastChild->doc = ctxt->node->doc;
	    ctxt->nodelen = len;
	    ctxt->nodemem = len + 1;
	} else {
	    xmlSAX2ErrMemory(ctxt, "xmlSAX2Characters");
	    return;
	}
    } else {
	int coalesceText = (lastChild != NULL) &&
	    (lastChild->type == type) &&
	    ((type != XML_TEXT_NODE) ||
             (lastChild->name == xmlStringText));
	if ((coalesceText) && (ctxt->nodemem != 0)) {
	    /*
	     * The whole point of maintaining nodelen and nodemem,
	     * xmlTextConcat is too costly, i.e. compute length,
	     * reallocate a new buffer, move data, append ch. Here
	     * We try to minimize realloc() uses and avoid copying
	     * and recomputing length over and over.
	     */
	    if (lastChild->content == (xmlChar *)&(lastChild->properties)) {
		lastChild->content = xmlStrdup(lastChild->content);
		lastChild->properties = NULL;
	    } else if ((ctxt->nodemem == ctxt->nodelen + 1) &&
	               (xmlDictOwns(ctxt->dict, lastChild->content))) {
		lastChild->content = xmlStrdup(lastChild->content);
	    }
	    if (lastChild->content == NULL) {
		xmlSAX2ErrMemory(ctxt, "xmlSAX2Characters: xmlStrdup returned NULL");
		return;
 	    }
	    if (ctxt->nodelen > INT_MAX - len) {
                xmlSAX2ErrMemory(ctxt, "xmlSAX2Characters overflow prevented");
                return;
	    }
            if ((ctxt->nodelen + len > XML_MAX_TEXT_LENGTH) &&
                ((ctxt->options & XML_PARSE_HUGE) == 0)) {
                xmlSAX2ErrMemory(ctxt, "xmlSAX2Characters: huge text node");
                return;
            }
	    if (ctxt->nodelen + len >= ctxt->nodemem) {
		xmlChar *newbuf;
		int size;

		size = ctxt->nodemem > INT_MAX - len ?
                       INT_MAX :
                       ctxt->nodemem + len;
		size = size > INT_MAX / 2 ? INT_MAX : size * 2;
                newbuf = (xmlChar *) xmlRealloc(lastChild->content,size);
		if (newbuf == NULL) {
		    xmlSAX2ErrMemory(ctxt, "xmlSAX2Characters");
		    return;
		}
		ctxt->nodemem = size;
		lastChild->content = newbuf;
	    }
	    memcpy(&lastChild->content[ctxt->nodelen], ch, len);
	    ctxt->nodelen += len;
	    lastChild->content[ctxt->nodelen] = 0;
	} else if (coalesceText) {
	    if (xmlTextConcat(lastChild, ch, len)) {
		xmlSAX2ErrMemory(ctxt, "xmlSAX2Characters");
	    }
	    if (ctxt->node->children != NULL) {
		ctxt->nodelen = xmlStrlen(lastChild->content);
		ctxt->nodemem = ctxt->nodelen + 1;
	    }
	} else {
	    /* Mixed content, first time */
            if (type == XML_TEXT_NODE) {
                lastChild = xmlSAX2TextNode(ctxt, ch, len);
                lastChild->doc = ctxt->myDoc;
            } else
                lastChild = xmlNewCDataBlock(ctxt->myDoc, ch, len);
	    if (lastChild != NULL) {
		xmlAddChild(ctxt->node, lastChild);
		if (ctxt->node->children != NULL) {
		    ctxt->nodelen = len;
		    ctxt->nodemem = len + 1;
		}
	    }
	}
    }
}